

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O3

void X86_Intel_printInst(MCInst *MI,SStream *O,void *Info)

{
  uint8_t *puVar1;
  char cVar2;
  byte bVar3;
  cs_mode cVar4;
  cs_detail *pcVar5;
  _Bool _Var6;
  uint uVar7;
  uint uVar8;
  x86_reg xVar9;
  undefined8 in_RAX;
  MCOperand *pMVar10;
  int64_t iVar11;
  MCRegisterClass *c;
  char *s;
  ulong uVar12;
  SStream *extraout_RDX;
  SStream *extraout_RDX_00;
  SStream *extraout_RDX_01;
  SStream *extraout_RDX_02;
  SStream *extraout_RDX_03;
  SStream *extraout_RDX_04;
  SStream *pSVar13;
  uint8_t uVar14;
  uint uVar15;
  int reg_00;
  x86_avx_bcast v;
  char *pcVar16;
  ulong uVar17;
  char *pcVar18;
  x86_reg reg2;
  x86_reg reg;
  undefined8 local_38;
  
  local_38 = in_RAX;
  uVar7 = MCInst_getOpcode(MI);
  if ((int)uVar7 < 0x269) {
    if (uVar7 == 0x15) {
      uVar7 = MCInst_getNumOperands(MI);
      if (uVar7 == 1) {
        pMVar10 = MCInst_getOperand(MI,0);
        _Var6 = MCOperand_isImm(pMVar10);
        if (_Var6) {
          pMVar10 = MCInst_getOperand(MI,0);
          iVar11 = MCOperand_getImm(pMVar10);
          if (iVar11 == 10) {
            pcVar16 = "aad";
            goto LAB_001a0f63;
          }
        }
      }
    }
    else if (uVar7 == 0x16) {
      uVar7 = MCInst_getNumOperands(MI);
      if (uVar7 == 1) {
        pMVar10 = MCInst_getOperand(MI,0);
        _Var6 = MCOperand_isImm(pMVar10);
        if (_Var6) {
          pMVar10 = MCInst_getOperand(MI,0);
          iVar11 = MCOperand_getImm(pMVar10);
          if (iVar11 == 10) {
            pcVar16 = "aam";
            goto LAB_001a0f63;
          }
        }
      }
    }
  }
  else if (uVar7 == 0x269) {
    uVar7 = MCInst_getNumOperands(MI);
    if (uVar7 == 6) {
      pMVar10 = MCInst_getOperand(MI,0);
      _Var6 = MCOperand_isReg(pMVar10);
      if (_Var6) {
        c = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,0x2a);
        pMVar10 = MCInst_getOperand(MI,0);
        uVar7 = MCOperand_getReg(pMVar10);
        _Var6 = MCRegisterClass_contains(c,uVar7);
        if (_Var6) {
          pcVar16 = anon_var_dwarf_e9fde;
          goto LAB_001a0f63;
        }
      }
    }
  }
  else if (uVar7 == 0x1879) {
    uVar7 = MCInst_getNumOperands(MI);
    if (uVar7 == 0) {
      pcVar16 = "xstorerng";
LAB_001a0f63:
      s = cs_strdup(pcVar16);
      for (pcVar16 = s; cVar2 = *pcVar16, cVar2 != '\0'; pcVar16 = pcVar16 + 1) {
        if ((cVar2 == ' ') || (cVar2 == '\t')) {
          *pcVar16 = '\0';
          pcVar16 = pcVar16 + 1;
          break;
        }
      }
      SStream_concat0(O,s);
      if (*pcVar16 != '\0') {
        SStream_concat0(O,anon_var_dwarf_7377b + 0x11);
        do {
          cVar2 = *pcVar16;
          if (cVar2 == '$') {
            if (pcVar16[1] == -1) {
              pcVar18 = pcVar16 + 3;
              if (pcVar16[3] == '\x01') {
                cVar2 = pcVar16[2];
                SStream_concat0(O,"qword ptr ");
                MI->x86opsize = '\b';
                printMemReference(MI,(int)cVar2 - 1,O);
              }
            }
            else {
              pcVar18 = pcVar16 + 1;
              printOperand(MI,(int)pcVar16[1] - 1,O);
            }
          }
          else {
            if (cVar2 == '\0') break;
            SStream_concat(O,"%c",(ulong)(uint)(int)cVar2);
            pcVar18 = pcVar16;
          }
          pcVar16 = pcVar18 + 1;
        } while( true );
      }
      if (s != (char *)0x0) {
        (*cs_mem_free)(s);
        goto switchD_001a10bb_default;
      }
    }
  }
  uVar8 = MCInst_getOpcode(MI);
  uVar7 = *(uint *)(printInstruction_OpInfo + (ulong)uVar8 * 4);
  uVar8 = *(uint *)(printInstruction_OpInfo2 + (ulong)uVar8 * 4);
  _Var6 = X86_lockrep(MI,O);
  if (!_Var6) {
    SStream_concat0(O,(char *)((ulong)(uVar7 & 0x3fff) + 0x32901f));
  }
  switch(uVar7 >> 0xe & 0x3f) {
  case 1:
    uVar15 = 0;
    goto LAB_001a1290;
  case 2:
    MI->x86opsize = '\x02';
    pcVar16 = "word ptr ";
    goto LAB_001a12ab;
  case 3:
    uVar15 = 1;
LAB_001a1290:
    printOperand(MI,uVar15,O);
    goto LAB_001a1537;
  case 4:
    MI->x86opsize = '\x04';
    pcVar16 = "dword ptr ";
LAB_001a12ab:
    SStream_concat0(O,pcVar16);
    break;
  case 5:
  case 8:
    SStream_concat0(O,"qword ptr ");
    MI->x86opsize = '\b';
    break;
  case 6:
    SStream_concat0(O,"byte ptr ");
    MI->x86opsize = '\x01';
    break;
  case 7:
    SStream_concat0(O,"dword ptr ");
    MI->x86opsize = '\x04';
    break;
  case 9:
    pMVar10 = MCInst_getOperand(MI,0);
    _Var6 = MCOperand_isImm(pMVar10);
    if (_Var6) {
      iVar11 = MCOperand_getImm(pMVar10);
      uVar12 = (ulong)MI->flat_insn->size + iVar11 + MI->address;
      cVar4 = MI->csh->mode;
      uVar17 = uVar12 & 0xffffffff;
      if (cVar4 == CS_MODE_64) {
        uVar17 = uVar12;
      }
      uVar15 = MI->Opcode;
      if (cVar4 == CS_MODE_16) {
        if ((uVar15 != 0x163) && (uVar15 != 0x44f)) {
          uVar17 = uVar12 & 0xffff;
        }
        if (uVar15 != 0x44f) goto LAB_001a1b8d;
        if (MI->x86_prefix[2] != 'f') goto LAB_001a1b9b;
LAB_001a1ba1:
        if (-1 < (long)uVar17) goto LAB_001a1ba6;
LAB_001a1bac:
        pcVar16 = " + 0x%lx";
      }
      else {
LAB_001a1b8d:
        if ((uVar15 != 0x44e) && (uVar15 != 0x162)) goto LAB_001a1ba1;
LAB_001a1b9b:
        uVar17 = uVar17 & 0xffff;
LAB_001a1ba6:
        if (9 < uVar17) goto LAB_001a1bac;
        pcVar16 = " + %lu";
      }
      SStream_concat(O,pcVar16 + 3,uVar17);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar5 = MI->flat_insn->detail;
        puVar1 = pcVar5->groups + (ulong)((uint)(pcVar5->field_6).x86.op_count * 0x30) + 0x3e;
        puVar1[0] = '\x02';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        pcVar5 = MI->flat_insn->detail;
        bVar3 = (pcVar5->field_6).x86.op_count;
        if (bVar3 == 0) {
          *(uint8_t *)((long)&pcVar5->field_6 + 0x50) = MI->imm_size;
        }
        else {
          pcVar5->groups[(ulong)((uint)bVar3 * 0x30) + 0x5e] =
               *(uint8_t *)((long)&pcVar5->field_6 + 0x50);
        }
        pcVar5 = MI->flat_insn->detail;
        *(ulong *)(pcVar5->groups + (ulong)((uint)(pcVar5->field_6).x86.op_count * 0x30) + 0x46) =
             uVar17;
        puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
        *puVar1 = *puVar1 + '\x01';
      }
      if (MI->op1_size == '\0') {
        MI->op1_size = MI->imm_size;
      }
    }
    goto LAB_001a1537;
  case 10:
    uVar15 = 7;
    goto LAB_001a13a2;
  case 0xb:
    uVar15 = 3;
LAB_001a13a2:
    printSSECC(MI,uVar15,O);
    goto LAB_001a1537;
  case 0xc:
    pcVar16 = "byte ptr ";
    SStream_concat0(O,"byte ptr ");
    uVar14 = '\x01';
    goto LAB_001a130d;
  case 0xd:
    pcVar16 = "dword ptr ";
    SStream_concat0(O,"dword ptr ");
    uVar14 = '\x04';
    goto LAB_001a130d;
  case 0xe:
    pcVar16 = "qword ptr ";
    SStream_concat0(O,"qword ptr ");
    uVar14 = '\b';
    goto LAB_001a130d;
  case 0xf:
    pcVar16 = "word ptr ";
    SStream_concat0(O,"word ptr ");
    uVar14 = '\x02';
LAB_001a130d:
    MI->x86opsize = uVar14;
    printSrcIdx(MI,1,O);
    SStream_concat0(O,", ");
    SStream_concat0(O,pcVar16);
    MI->x86opsize = uVar14;
    printDstIdx(MI,0,O);
    goto switchD_001a10bb_default;
  case 0x10:
  case 0x24:
    SStream_concat0(O,"xmmword ptr ");
    MI->x86opsize = '\x10';
    break;
  case 0x11:
    uVar7 = 0;
    goto LAB_001a1981;
  case 0x12:
    SStream_concat0(O,"byte ptr ");
    MI->x86opsize = '\x01';
    goto LAB_001a152a;
  case 0x13:
    SStream_concat0(O,"dword ptr ");
    MI->x86opsize = '\x04';
    goto LAB_001a152a;
  case 0x14:
    SStream_concat0(O,"word ptr ");
    MI->x86opsize = '\x02';
    goto LAB_001a152a;
  case 0x15:
    uVar15 = 7;
    goto LAB_001a14a6;
  case 0x16:
    uVar15 = 3;
LAB_001a14a6:
    printAVXCC(MI,uVar15,O);
    goto LAB_001a1537;
  case 0x17:
    SStream_concat0(O,"xword ptr ");
    MI->x86opsize = '\n';
    uVar7 = 0;
    goto LAB_001a1b80;
  case 0x18:
    SStream_concat0(O,"byte ptr ");
    MI->x86opsize = '\x01';
    goto LAB_001a17d3;
  case 0x19:
    SStream_concat0(O,"dword ptr ");
    MI->x86opsize = '\x04';
    goto LAB_001a17d3;
  case 0x1a:
    SStream_concat0(O,"qword ptr ");
    MI->x86opsize = '\b';
    goto LAB_001a17d3;
  case 0x1b:
    SStream_concat0(O,"word ptr ");
    MI->x86opsize = '\x02';
LAB_001a17d3:
    printSrcIdx(MI,0,O);
    goto switchD_001a10bb_default;
  case 0x1c:
    MI->x86opsize = '\x02';
    pcVar16 = "word ptr ";
    goto LAB_001a1781;
  case 0x1d:
    MI->x86opsize = '\x04';
    pcVar16 = "dword ptr ";
LAB_001a1781:
    SStream_concat0(O,pcVar16);
    goto LAB_001a1789;
  case 0x1e:
    SStream_concat0(O,"qword ptr ");
    MI->x86opsize = '\b';
    goto LAB_001a1789;
  case 0x1f:
    SStream_concat0(O,"byte ptr ");
    MI->x86opsize = '\x01';
LAB_001a1789:
    printMemReference(MI,2,O);
LAB_001a1799:
    SStream_concat0(O,", ");
    uVar7 = 1;
    goto LAB_001a17b0;
  case 0x20:
    SStream_concat0(O,"word ptr ");
    MI->x86opsize = '\x02';
    pSVar13 = extraout_RDX_02;
    goto LAB_001a148e;
  case 0x21:
    SStream_concat0(O,"dword ptr ");
    MI->x86opsize = '\x04';
    pSVar13 = extraout_RDX_01;
    goto LAB_001a148e;
  case 0x22:
    SStream_concat0(O,"qword ptr ");
    MI->x86opsize = '\b';
    pSVar13 = extraout_RDX_00;
    goto LAB_001a148e;
  case 0x23:
    SStream_concat0(O,"byte ptr ");
    MI->x86opsize = '\x01';
    pSVar13 = extraout_RDX;
LAB_001a148e:
    printMemOffset(MI,(uint)O,pSVar13);
    goto LAB_001a1537;
  case 0x25:
    SStream_concat0(O,"qword ptr ");
    MI->x86opsize = '\b';
LAB_001a152a:
    printDstIdx(MI,0,O);
    goto LAB_001a1537;
  case 0x26:
  case 0x27:
    SStream_concat0(O,"ymmword ptr ");
    MI->x86opsize = ' ';
    break;
  case 0x28:
  case 0x29:
    SStream_concat0(O,"zmmword ptr ");
    MI->x86opsize = '@';
    break;
  case 0x2a:
    MI->x86opsize = '\x04';
    SStream_concat0(O,"dword ptr ");
    goto LAB_001a14c9;
  case 0x2b:
    SStream_concat0(O,"qword ptr ");
    MI->x86opsize = '\b';
LAB_001a14c9:
    printMemReference(MI,1,O);
    SStream_concat0(O," {");
    printOperand(MI,6,O);
    pcVar16 = "}, ";
    goto LAB_001a14ff;
  case 0x2c:
    printOperand(MI,2,O);
    goto LAB_001a1799;
  default:
    goto switchD_001a10bb_default;
  }
  printMemReference(MI,0,O);
LAB_001a1537:
  pcVar16 = ", ";
  switch(uVar7 >> 0x14 & 0x1f) {
  case 1:
    break;
  case 2:
    SStream_concat0(O,", st(0)");
    reg_00 = 0x6a;
    goto LAB_001a1ac9;
  case 3:
    pcVar16 = "pd\t";
    goto LAB_001a1664;
  case 4:
    pcVar16 = "ps\t";
    goto LAB_001a1664;
  case 5:
    pcVar16 = "sd\t";
    goto LAB_001a1664;
  case 6:
    pcVar16 = "ss\t";
LAB_001a1664:
    SStream_concat0(O,pcVar16);
    uVar15 = 0;
    goto LAB_001a16f6;
  case 7:
    SStream_concat0(O,":");
    goto switchD_001a172d_caseD_18;
  case 8:
    SStream_concat0(O,", dx");
    reg_00 = 0x12;
    goto LAB_001a1ac9;
  case 9:
    SStream_concat0(O,", ax");
    reg_00 = 3;
    goto LAB_001a1ac9;
  case 10:
    SStream_concat0(O,", eax");
    reg_00 = 0x13;
    goto LAB_001a1ac9;
  case 0xb:
    SStream_concat0(O,", rax");
    reg_00 = 0x23;
    goto LAB_001a1ac9;
  case 0xc:
    SStream_concat0(O,", al");
    reg_00 = 2;
    goto LAB_001a1ac9;
  case 0xd:
    SStream_concat0(O,", 1");
    op_addImm(MI,1);
    goto switchD_001a10bb_default;
  case 0xe:
    goto switchD_001a1562_caseD_e;
  default:
    goto switchD_001a10bb_default;
  case 0x10:
    pcVar16 = " {";
    break;
  case 0x11:
    pcVar16 = "pd \t";
    goto LAB_001a16c7;
  case 0x12:
    pcVar16 = "ps \t";
    goto LAB_001a16c7;
  case 0x13:
    pcVar16 = "}, ";
    break;
  case 0x14:
    pcVar16 = "d\t";
    goto LAB_001a16c7;
  case 0x15:
    pcVar16 = "q\t";
    goto LAB_001a16c7;
  case 0x16:
    pcVar16 = "ud\t";
    goto LAB_001a16c7;
  case 0x17:
    pcVar16 = "uq\t";
LAB_001a16c7:
    SStream_concat0(O,pcVar16);
    printOperand(MI,0,O);
    SStream_concat0(O,", ");
    uVar15 = 1;
LAB_001a16f6:
    pcVar16 = ", ";
    printOperand(MI,uVar15,O);
  }
  SStream_concat0(O,pcVar16);
  switch(uVar7 >> 0x19 & 0x3f) {
  case 1:
    uVar15 = 2;
    goto LAB_001a1a73;
  case 2:
    uVar15 = 2;
    goto LAB_001a1957;
  case 3:
    uVar15 = 2;
    goto LAB_001a19ab;
  case 4:
    uVar15 = 2;
    goto LAB_001a1996;
  case 5:
    uVar15 = 2;
    goto LAB_001a182b;
  case 6:
    uVar15 = 2;
    goto LAB_001a192d;
  case 7:
    printf64mem(MI,2,O);
    break;
  case 8:
    printf32mem(MI,2,O);
    break;
  case 9:
    uVar15 = 1;
LAB_001a19ab:
    printi32mem(MI,uVar15,O);
    break;
  case 10:
    uVar15 = 1;
    goto LAB_001a1a73;
  case 0xb:
    uVar15 = 1;
LAB_001a1996:
    printi64mem(MI,uVar15,O);
    break;
  case 0xc:
    uVar15 = 2;
    goto LAB_001a1840;
  case 0xd:
    uVar15 = 1;
LAB_001a1840:
    printi128mem(MI,uVar15,O);
    break;
  case 0xe:
    uVar15 = 1;
LAB_001a1957:
    printi16mem(MI,uVar15,O);
    break;
  case 0xf:
    uVar15 = 1;
LAB_001a182b:
    printi8mem(MI,uVar15,O);
    break;
  case 0x10:
    uVar15 = 1;
LAB_001a192d:
    printf128mem(MI,uVar15,O);
    break;
  case 0x11:
    printf64mem(MI,1,O);
    goto switchD_001a10bb_default;
  case 0x12:
    printf32mem(MI,1,O);
    goto switchD_001a10bb_default;
  case 0x13:
    uVar7 = 1;
LAB_001a1981:
    printopaquemem(MI,uVar7,O);
    goto switchD_001a10bb_default;
  case 0x14:
    printSrcIdx8(MI,1,O);
    goto switchD_001a10bb_default;
  case 0x15:
    printSrcIdx32(MI,1,O);
    goto switchD_001a10bb_default;
  case 0x16:
    printSrcIdx64(MI,1,O);
    goto switchD_001a10bb_default;
  case 0x17:
    printSrcIdx16(MI,1,O);
    goto switchD_001a10bb_default;
  case 0x18:
switchD_001a172d_caseD_18:
    uVar7 = 0;
    goto LAB_001a17b0;
  case 0x19:
    printi256mem(MI,1,O);
    break;
  case 0x1a:
    printf512mem(MI,2,O);
    SStream_concat0(O,", ");
    printAVXCC(MI,7,O);
    goto switchD_001a10bb_default;
  case 0x1b:
    printi512mem(MI,1,O);
    break;
  case 0x1c:
    printf256mem(MI,1,O);
    break;
  case 0x1d:
    printf512mem(MI,1,O);
    break;
  case 0x1e:
    printi64mem(MI,3,O);
    goto LAB_001a1a3d;
  case 0x1f:
    printOperand(MI,3,O);
    SStream_concat0(O,"}, ");
    break;
  case 0x20:
    printi32mem(MI,3,O);
LAB_001a1a3d:
    SStream_concat0(O,", ");
    goto LAB_001a1a4c;
  case 0x21:
    uVar7 = 2;
    goto LAB_001a19e4;
  default:
    uVar15 = 5;
LAB_001a1a73:
    printOperand(MI,uVar15,O);
  }
  switch((uint)(CONCAT44(uVar8,uVar7) >> 0x1f) & 0xf) {
  case 1:
    pcVar16 = ", ";
    break;
  default:
    goto switchD_001a10bb_default;
  case 3:
switchD_001a1562_caseD_e:
    SStream_concat0(O,", cl");
    reg_00 = 10;
LAB_001a1ac9:
    op_addReg(MI,reg_00);
    goto switchD_001a10bb_default;
  case 4:
    pcVar16 = "}, ";
    break;
  case 5:
    SStream_concat0(O,"} {z}, ");
    op_addAvxZeroOpmask(MI);
    pSVar13 = extraout_RDX_04;
    goto LAB_001a1afb;
  case 6:
    goto switchD_001a1aa7_caseD_6;
  case 7:
    SStream_concat0(O,"qword ptr ");
    MI->x86opsize = '\b';
    goto LAB_001a1b78;
  case 8:
    MI->x86opsize = '\x04';
    SStream_concat0(O,"dword ptr ");
LAB_001a1b78:
    uVar7 = 4;
LAB_001a1b80:
    printMemReference(MI,uVar7,O);
    goto switchD_001a10bb_default;
  case 9:
    goto switchD_001a1aa7_caseD_9;
  case 10:
    goto switchD_001a1aa7_caseD_a;
  }
  SStream_concat0(O,pcVar16);
  pSVar13 = extraout_RDX_03;
LAB_001a1afb:
  switch(uVar8 >> 3 & 0x1f) {
  case 1:
    printOperand(MI,2,O);
    switch(uVar8 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a1f83_caseD_1;
    case 2:
      goto switchD_001a1aa7_caseD_a;
    case 3:
      goto switchD_001a1aa7_caseD_9;
    case 4:
      goto switchD_001a1f83_caseD_4;
    case 5:
      goto switchD_001a1f83_caseD_5;
    case 6:
switchD_001a1aa7_caseD_6:
      SStream_concat0(O,", {sae}");
      op_addAvxSae(MI);
      break;
    }
  case 2:
    printi32mem(MI,2,O);
    switch(uVar8 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a1f83_caseD_1;
    case 2:
      goto switchD_001a1aa7_caseD_a;
    case 3:
      goto switchD_001a1aa7_caseD_9;
    case 4:
      goto switchD_001a1f83_caseD_4;
    case 5:
      goto switchD_001a1f83_caseD_5;
    case 6:
      goto switchD_001a1aa7_caseD_6;
    }
  case 3:
    printi64mem(MI,2,O);
    switch(uVar8 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a1f83_caseD_1;
    case 2:
      goto switchD_001a1aa7_caseD_a;
    case 3:
      goto switchD_001a1aa7_caseD_9;
    case 4:
      goto switchD_001a1f83_caseD_4;
    case 5:
      goto switchD_001a1f83_caseD_5;
    case 6:
      goto switchD_001a1aa7_caseD_6;
    }
  case 4:
    goto switchD_001a1b1f_caseD_4;
  case 5:
    printOperand(MI,3,O);
    switch(uVar8 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a1f83_caseD_1;
    case 2:
      goto switchD_001a1aa7_caseD_a;
    case 3:
      goto switchD_001a1aa7_caseD_9;
    case 4:
      goto switchD_001a1f83_caseD_4;
    case 5:
      goto switchD_001a1f83_caseD_5;
    case 6:
      goto switchD_001a1aa7_caseD_6;
    }
  case 6:
    printf64mem(MI,2,O);
    switch(uVar8 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a1f83_caseD_1;
    case 2:
      goto switchD_001a1aa7_caseD_a;
    case 3:
      goto switchD_001a1aa7_caseD_9;
    case 4:
      goto switchD_001a1f83_caseD_4;
    case 5:
      goto switchD_001a1f83_caseD_5;
    case 6:
      goto switchD_001a1aa7_caseD_6;
    }
  case 7:
    printf32mem(MI,2,O);
    switch(uVar8 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a1f83_caseD_1;
    case 2:
      goto switchD_001a1aa7_caseD_a;
    case 3:
      goto switchD_001a1aa7_caseD_9;
    case 4:
      goto switchD_001a1f83_caseD_4;
    case 5:
      goto switchD_001a1f83_caseD_5;
    case 6:
      goto switchD_001a1aa7_caseD_6;
    }
  case 8:
    printf256mem(MI,2,O);
    switch(uVar8 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a1f83_caseD_1;
    case 2:
      goto switchD_001a1aa7_caseD_a;
    case 3:
      goto switchD_001a1aa7_caseD_9;
    case 4:
      goto switchD_001a1f83_caseD_4;
    case 5:
      goto switchD_001a1f83_caseD_5;
    case 6:
      goto switchD_001a1aa7_caseD_6;
    }
  case 9:
    printf512mem(MI,2,O);
    switch(uVar8 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a1f83_caseD_1;
    case 2:
      goto switchD_001a1aa7_caseD_a;
    case 3:
      goto switchD_001a1aa7_caseD_9;
    case 4:
      goto switchD_001a1f83_caseD_4;
    case 5:
      goto switchD_001a1f83_caseD_5;
    case 6:
      goto switchD_001a1aa7_caseD_6;
    }
  case 10:
    printf128mem(MI,2,O);
    switch(uVar8 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a1f83_caseD_1;
    case 2:
      goto switchD_001a1aa7_caseD_a;
    case 3:
      goto switchD_001a1aa7_caseD_9;
    case 4:
      goto switchD_001a1f83_caseD_4;
    case 5:
      goto switchD_001a1f83_caseD_5;
    case 6:
      goto switchD_001a1aa7_caseD_6;
    }
  case 0xb:
    printi128mem(MI,2,O);
    switch(uVar8 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a1f83_caseD_1;
    case 2:
      goto switchD_001a1aa7_caseD_a;
    case 3:
      goto switchD_001a1aa7_caseD_9;
    case 4:
      goto switchD_001a1f83_caseD_4;
    case 5:
      goto switchD_001a1f83_caseD_5;
    case 6:
      goto switchD_001a1aa7_caseD_6;
    }
  case 0xc:
    printi512mem(MI,2,O);
    switch(uVar8 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a1f83_caseD_1;
    case 2:
      goto switchD_001a1aa7_caseD_a;
    case 3:
      goto switchD_001a1aa7_caseD_9;
    case 4:
      goto switchD_001a1f83_caseD_4;
    case 5:
      goto switchD_001a1f83_caseD_5;
    case 6:
      goto switchD_001a1aa7_caseD_6;
    }
  case 0xd:
    printi256mem(MI,2,O);
    switch(uVar8 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a1f83_caseD_1;
    case 2:
      goto switchD_001a1aa7_caseD_a;
    case 3:
      goto switchD_001a1aa7_caseD_9;
    case 4:
      goto switchD_001a1f83_caseD_4;
    case 5:
      goto switchD_001a1f83_caseD_5;
    case 6:
      goto switchD_001a1aa7_caseD_6;
    }
  case 0xe:
    printRoundingControl(MI,(uint)O,pSVar13);
    break;
  case 0xf:
switchD_001a1b1f_caseD_f:
    printf512mem(MI,3,O);
    break;
  case 0x10:
    printf64mem(MI,3,O);
    switch(uVar8 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a1f83_caseD_1;
    case 2:
      goto switchD_001a1aa7_caseD_a;
    case 3:
      goto switchD_001a1aa7_caseD_9;
    case 4:
      goto switchD_001a1f83_caseD_4;
    case 5:
      goto switchD_001a1f83_caseD_5;
    case 6:
      goto switchD_001a1aa7_caseD_6;
    }
  case 0x11:
    printf32mem(MI,3,O);
    switch(uVar8 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a1f83_caseD_1;
    case 2:
      goto switchD_001a1aa7_caseD_a;
    case 3:
      goto switchD_001a1aa7_caseD_9;
    case 4:
      goto switchD_001a1f83_caseD_4;
    case 5:
      goto switchD_001a1f83_caseD_5;
    case 6:
      goto switchD_001a1aa7_caseD_6;
    }
  case 0x12:
    printf128mem(MI,3,O);
    break;
  case 0x13:
    printf256mem(MI,3,O);
    break;
  case 0x14:
switchD_001a1b1f_caseD_14:
    printi128mem(MI,3,O);
    break;
  case 0x15:
switchD_001a1b1f_caseD_15:
    printi256mem(MI,3,O);
    break;
  case 0x16:
    uVar7 = 3;
LAB_001a19e4:
    printi512mem(MI,uVar7,O);
    break;
  case 0x17:
    uVar7 = 3;
LAB_001a1ef8:
    printi32mem(MI,uVar7,O);
    goto switchD_001a1aa7_caseD_9;
  case 0x18:
    uVar7 = 3;
LAB_001a1f36:
    printi64mem(MI,uVar7,O);
switchD_001a1aa7_caseD_a:
    SStream_concat0(O,"{1to8}");
    v = X86_AVX_BCAST_8;
LAB_001a1f55:
    op_addAvxBroadcast(MI,v);
    break;
  case 0x19:
    printi8mem(MI,2,O);
    goto LAB_001a1d7a;
  case 0x1a:
    printi16mem(MI,2,O);
LAB_001a1d7a:
    pcVar16 = ", ";
LAB_001a14ff:
    SStream_concat0(O,pcVar16);
switchD_001a1b1f_caseD_4:
    uVar7 = 7;
    goto LAB_001a17b0;
  default:
    printOperand(MI,6,O);
    switch(uVar8 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001a1f83_caseD_1;
    case 2:
      goto switchD_001a1aa7_caseD_a;
    case 3:
      goto switchD_001a1aa7_caseD_9;
    case 4:
      goto switchD_001a1f83_caseD_4;
    case 5:
      goto switchD_001a1f83_caseD_5;
    case 6:
      goto switchD_001a1aa7_caseD_6;
    }
  }
switchD_001a10bb_default:
  uVar7 = MCInst_getOpcode(MI);
  xVar9 = X86_insn_reg_intel(uVar7);
  uVar17 = (ulong)xVar9;
  if (MI->csh->detail != CS_OPT_OFF) {
    local_38._4_4_ = xVar9;
    if (xVar9 == X86_REG_INVALID) {
      uVar7 = MCInst_getOpcode(MI);
      _Var6 = X86_insn_reg_intel2(uVar7,(x86_reg *)((long)&local_38 + 4),(x86_reg *)&local_38);
      uVar17 = (ulong)local_38._4_4_;
      if (_Var6) {
        (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
        (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = local_38._4_4_;
        *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x50) = MI->csh->regsize_map[uVar17];
        (MI->flat_insn->detail->field_6).x86.operands[1].type = X86_OP_REG;
        (MI->flat_insn->detail->field_6).x86.operands[1].field_1.reg = (x86_reg)local_38;
        *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x80) =
             MI->csh->regsize_map[(x86_reg)local_38];
        (MI->flat_insn->detail->field_6).x86.op_count = '\x02';
      }
    }
    else {
      pcVar5 = MI->flat_insn->detail;
      memmove((void *)((long)&pcVar5->field_6 + 0x60),(void *)((long)&pcVar5->field_6 + 0x30),0x150)
      ;
      (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
      (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = xVar9;
      *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x50) = MI->csh->regsize_map[xVar9];
      *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x80) = MI->csh->regsize_map[xVar9];
      puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
      *puVar1 = *puVar1 + '\x01';
    }
  }
  if ((int)uVar17 != 0 && MI->op1_size == '\0') {
    MI->op1_size = MI->csh->regsize_map[uVar17];
  }
  return;
switchD_001a1f83_caseD_1:
  SStream_concat0(O,", ");
  switch(uVar8 >> 0xb & 0xf) {
  case 0:
    uVar7 = 4;
    goto LAB_001a2266;
  case 1:
    uVar7 = 7;
    goto LAB_001a2266;
  case 2:
    printf64mem(MI,3,O);
    break;
  case 3:
    goto switchD_001a1b1f_caseD_f;
  case 4:
    uVar7 = 3;
LAB_001a2266:
    printOperand(MI,uVar7,O);
    break;
  case 5:
    printf32mem(MI,3,O);
    break;
  case 6:
    printf128mem(MI,3,O);
    break;
  case 7:
    printf256mem(MI,3,O);
    break;
  case 8:
    uVar7 = 4;
    goto LAB_001a1ef8;
  case 9:
    printi32mem(MI,3,O);
    break;
  case 10:
    uVar7 = 4;
    goto LAB_001a19e4;
  case 0xb:
    printi512mem(MI,3,O);
    break;
  case 0xc:
    uVar7 = 4;
    goto LAB_001a1f36;
  case 0xd:
    printi64mem(MI,3,O);
    break;
  case 0xe:
    goto switchD_001a1b1f_caseD_14;
  case 0xf:
    goto switchD_001a1b1f_caseD_15;
  }
  switch(uVar8 >> 0xf & 7) {
  case 1:
    SStream_concat0(O,", ");
    uVar7 = uVar8 >> 0x12 & 3;
    if (uVar7 == 1) {
      uVar7 = 5;
    }
    else if (uVar7 == 2) {
      uVar7 = 4;
    }
    else {
LAB_001a1a4c:
      uVar7 = 8;
    }
LAB_001a17b0:
    printOperand(MI,uVar7,O);
    goto switchD_001a10bb_default;
  case 2:
    goto switchD_001a1aa7_caseD_a;
  case 3:
switchD_001a1aa7_caseD_9:
    SStream_concat0(O,"{1to16}");
    v = X86_AVX_BCAST_16;
    break;
  case 4:
switchD_001a1f83_caseD_4:
    SStream_concat0(O,"{1to4}");
    v = X86_AVX_BCAST_4;
    break;
  case 5:
switchD_001a1f83_caseD_5:
    SStream_concat0(O,"{1to2}");
    v = X86_AVX_BCAST_2;
    break;
  default:
    goto switchD_001a10bb_default;
  }
  goto LAB_001a1f55;
}

Assistant:

void X86_Intel_printInst(MCInst *MI, SStream *O, void *Info)
{
	char *mnem;
	x86_reg reg, reg2;

	// Try to print any aliases first.
	mnem = printAliasInstr(MI, O, Info);
	if (mnem)
		cs_mem_free(mnem);
	else
		printInstruction(MI, O, Info);

	reg = X86_insn_reg_intel(MCInst_getOpcode(MI));
	if (MI->csh->detail) {
		// first op can be embedded in the asm by llvm.
		// so we have to add the missing register as the first operand
		if (reg) {
			// shift all the ops right to leave 1st slot for this new register op
			memmove(&(MI->flat_insn->detail->x86.operands[1]), &(MI->flat_insn->detail->x86.operands[0]),
					sizeof(MI->flat_insn->detail->x86.operands[0]) * (ARR_SIZE(MI->flat_insn->detail->x86.operands) - 1));
			MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
			MI->flat_insn->detail->x86.operands[0].reg = reg;
			MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
			MI->flat_insn->detail->x86.operands[1].size = MI->csh->regsize_map[reg];
			MI->flat_insn->detail->x86.op_count++;
		} else {
			if (X86_insn_reg_intel2(MCInst_getOpcode(MI), &reg, &reg2)) {
				MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[0].reg = reg;
				MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
				MI->flat_insn->detail->x86.operands[1].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[1].reg = reg2;
				MI->flat_insn->detail->x86.operands[1].size = MI->csh->regsize_map[reg2];
				MI->flat_insn->detail->x86.op_count = 2;
			}
		}
	}

	if (MI->op1_size == 0 && reg)
		MI->op1_size = MI->csh->regsize_map[reg];
}